

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<std::complex<double>_>::Simetrize(TPZMatrix<std::complex<double>_> *this)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar6 = (this->super_TPZBaseMatrix).fRow;
  if (lVar6 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar6 = (this->super_TPZBaseMatrix).fRow;
  }
  lVar2 = 0;
  lVar5 = 0;
  if (0 < lVar6) {
    lVar5 = lVar6;
  }
  while (lVar7 = lVar2, lVar7 != lVar5) {
    for (lVar8 = lVar7 + 1; lVar2 = lVar7 + 1, lVar8 < lVar6; lVar8 = lVar8 + 1) {
      iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar7,lVar8);
      iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar8,lVar7);
      uVar1 = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
      *(undefined8 *)CONCAT44(extraout_var_00,iVar4) = *(undefined8 *)CONCAT44(extraout_var,iVar3);
      ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1] = uVar1;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}